

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

xmlChar * xmlGetPropNodeValueInternal(xmlAttr *prop)

{
  xmlChar *pxVar1;
  
  if (prop->type == XML_ATTRIBUTE_DECL) {
    pxVar1 = xmlStrdup((xmlChar *)prop->psvi);
    return pxVar1;
  }
  if (prop->type == XML_ATTRIBUTE_NODE) {
    pxVar1 = xmlNodeGetContent((xmlNode *)prop);
    return pxVar1;
  }
  return (xmlChar *)0x0;
}

Assistant:

static xmlChar*
xmlGetPropNodeValueInternal(const xmlAttr *prop)
{
    if (prop == NULL)
	return(NULL);
    if (prop->type == XML_ATTRIBUTE_NODE) {
	return(xmlNodeGetContent((xmlNodePtr) prop));
    } else if (prop->type == XML_ATTRIBUTE_DECL) {
	return(xmlStrdup(((xmlAttributePtr)prop)->defaultValue));
    }
    return(NULL);
}